

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_vdf.c
# Opt level: O3

PHYSFS_sint64 vdfDosTimeToEpoch(PHYSFS_uint32 dostime)

{
  time_t tVar1;
  tm local_38;
  
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_isdst = 0;
  local_38._36_4_ = 0;
  local_38.tm_year = (dostime >> 0x19) + 0x50;
  local_38.tm_mon = (dostime >> 0x15 & 0xf) - 1;
  local_38.tm_mday = dostime >> 0x10 & 0x1f;
  local_38.tm_hour = dostime >> 0xb & 0x1f;
  local_38.tm_min = dostime >> 5 & 0x3f;
  local_38.tm_sec = dostime * 2 & 0x3e;
  tVar1 = mktime(&local_38);
  return tVar1;
}

Assistant:

static PHYSFS_sint64 vdfDosTimeToEpoch(const PHYSFS_uint32 dostime)
{
    /* VDF stores timestamps as 32bit DOS dates: the seconds are counted in
       2-seconds intervals and the years are counted since 1 Jan. 1980 */
    struct tm t;
    memset(&t, '\0', sizeof (t));
    t.tm_year = ((int) ((dostime >> 25) & 0x7F)) + 80; /* 1980 to 1900 */
    t.tm_mon = ((int) ((dostime >> 21) & 0xF)) - 1;  /* 1-12 to 0-11 */
    t.tm_mday = (int) ((dostime >> 16) & 0x1F);
    t.tm_hour = (int) ((dostime >> 11) & 0x1F);
    t.tm_min = (int) ((dostime >> 5) & 0x3F);
    t.tm_sec = ((int) ((dostime >> 0) & 0x1F)) * 2;  /* 2 seconds to 1. */
    return (PHYSFS_sint64) mktime(&t);
}